

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attribute_quantization_transform.cc
# Opt level: O2

bool __thiscall
draco::AttributeQuantizationTransform::ComputeParameters
          (AttributeQuantizationTransform *this,PointAttribute *attribute,int quantization_bits)

{
  float *pfVar1;
  byte bVar2;
  uint uVar3;
  float fVar4;
  long lVar5;
  DataBuffer *pDVar6;
  size_t sVar7;
  pointer pfVar8;
  vector<float,_std::allocator<float>_> *pvVar9;
  __uniq_ptr_data<float,_std::default_delete<float[]>,_true,_true> __dest;
  int c_1;
  ulong uVar10;
  AttributeValueIndex i;
  ulong uVar11;
  ulong __n;
  bool bVar12;
  float fVar13;
  float fVar14;
  allocator_type local_71;
  vector<float,_std::allocator<float>_> *local_70;
  unique_ptr<float[],_std::default_delete<float[]>_> att_val;
  unique_ptr<float[],_std::default_delete<float[]>_> max_values;
  
  bVar12 = false;
  if ((quantization_bits - 1U < 0x1e) && (bVar12 = false, this->quantization_bits_ == -1)) {
    this->quantization_bits_ = quantization_bits;
    bVar2 = (attribute->super_GeometryAttribute).num_components_;
    __n = (ulong)bVar2;
    this->range_ = 0.0;
    att_val._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
    super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
    super__Head_base<0UL,_float_*,_false>._M_head_impl =
         (__uniq_ptr_data<float,_std::default_delete<float[]>,_true,_true>)
         ((ulong)att_val._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
                 super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                 super__Head_base<0UL,_float_*,_false>._M_head_impl & 0xffffffff00000000);
    std::vector<float,_std::allocator<float>_>::vector
              ((vector<float,_std::allocator<float>_> *)&max_values,__n,
               (value_type_conflict2 *)&att_val,&local_71);
    local_70 = &this->min_values_;
    std::vector<float,_std::allocator<float>_>::_M_move_assign
              (local_70,(_Vector_base<float,_std::allocator<float>_> *)&max_values);
    std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
              ((_Vector_base<float,_std::allocator<float>_> *)&max_values);
    uVar11 = (ulong)bVar2 << 2;
    max_values._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
    super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
    super__Head_base<0UL,_float_*,_false>._M_head_impl =
         (__uniq_ptr_data<float,_std::default_delete<float[]>,_true,_true>)operator_new__(uVar11);
    __dest.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
    super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
    super__Head_base<0UL,_float_*,_false>._M_head_impl =
         (__uniq_ptr_impl<float,_std::default_delete<float[]>_>)operator_new__(uVar11);
    lVar5 = (attribute->super_GeometryAttribute).byte_offset_;
    pDVar6 = (attribute->super_GeometryAttribute).buffer_;
    sVar7 = (attribute->super_GeometryAttribute).byte_stride_;
    att_val._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
    super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
    super__Head_base<0UL,_float_*,_false>._M_head_impl =
         (__uniq_ptr_data<float,_std::default_delete<float[]>,_true,_true>)
         (__uniq_ptr_data<float,_std::default_delete<float[]>,_true,_true>)
         __dest.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
         super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
         super__Head_base<0UL,_float_*,_false>._M_head_impl;
    memcpy((void *)__dest.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
                   super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                   super__Head_base<0UL,_float_*,_false>._M_head_impl,
           (void *)((long)(pDVar6->data_).
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start + lVar5),sVar7);
    memcpy((local_70->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
           super__Vector_impl_data._M_start,
           (void *)(lVar5 + (long)(pDVar6->data_).
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_start),sVar7);
    memcpy((void *)max_values._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
                   super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                   super__Head_base<0UL,_float_*,_false>._M_head_impl,
           (void *)((long)(((attribute->super_GeometryAttribute).buffer_)->data_).
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start +
                   (attribute->super_GeometryAttribute).byte_offset_),
           (attribute->super_GeometryAttribute).byte_stride_);
    pvVar9 = local_70;
    uVar3 = attribute->num_unique_entries_;
    lVar5 = (attribute->super_GeometryAttribute).byte_offset_;
    pDVar6 = (attribute->super_GeometryAttribute).buffer_;
    sVar7 = (attribute->super_GeometryAttribute).byte_stride_;
    for (uVar11 = 1; uVar11 < uVar3; uVar11 = uVar11 + 1) {
      memcpy((void *)__dest.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
                     super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                     super__Head_base<0UL,_float_*,_false>._M_head_impl,
             (void *)((long)(pDVar6->data_).
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start + lVar5 + sVar7 * uVar11),sVar7
            );
      pfVar8 = (pvVar9->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
               super__Vector_impl_data._M_start;
      for (uVar10 = 0; __n != uVar10; uVar10 = uVar10 + 1) {
        fVar13 = *(float *)((long)__dest.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                                  super__Head_base<0UL,_float_*,_false>._M_head_impl + uVar10 * 4);
        if (fVar13 < pfVar8[uVar10]) {
          pfVar8[uVar10] = fVar13;
          fVar13 = *(float *)((long)__dest.
                                    super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t
                                    .super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                                    super__Head_base<0UL,_float_*,_false>._M_head_impl + uVar10 * 4)
          ;
        }
        pfVar1 = (float *)((long)max_values._M_t.
                                 super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
                                 super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                                 super__Head_base<0UL,_float_*,_false>._M_head_impl + uVar10 * 4);
        if (*pfVar1 <= fVar13 && fVar13 != *pfVar1) {
          *(float *)((long)max_values._M_t.
                           super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
                           super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                           super__Head_base<0UL,_float_*,_false>._M_head_impl + uVar10 * 4) = fVar13
          ;
        }
      }
    }
    fVar13 = this->range_;
    pfVar8 = (this->min_values_).super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_start;
    for (uVar11 = 0; __n != uVar11; uVar11 = uVar11 + 1) {
      fVar4 = pfVar8[uVar11];
      if ((0x7f7fffff < (uint)ABS(fVar4)) ||
         (fVar14 = *(float *)((long)max_values._M_t.
                                    super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t
                                    .super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                                    super__Head_base<0UL,_float_*,_false>._M_head_impl + uVar11 * 4)
         , 0x7f7fffff < (uint)ABS(fVar14))) {
        bVar12 = __n <= uVar11;
        goto LAB_001892f3;
      }
      fVar14 = fVar14 - fVar4;
      if (fVar13 < fVar14) {
        this->range_ = fVar14;
        fVar13 = fVar14;
      }
    }
    bVar12 = true;
    if ((fVar13 == 0.0) && (!NAN(fVar13))) {
      this->range_ = 1.0;
    }
LAB_001892f3:
    std::unique_ptr<float[],_std::default_delete<float[]>_>::~unique_ptr(&att_val);
    std::unique_ptr<float[],_std::default_delete<float[]>_>::~unique_ptr(&max_values);
  }
  return bVar12;
}

Assistant:

bool AttributeQuantizationTransform::ComputeParameters(
    const PointAttribute &attribute, const int quantization_bits) {
  if (quantization_bits_ != -1) {
    return false;  // already initialized.
  }
  if (!IsQuantizationValid(quantization_bits)) {
    return false;
  }
  quantization_bits_ = quantization_bits;

  const int num_components = attribute.num_components();
  range_ = 0.f;
  min_values_ = std::vector<float>(num_components, 0.f);
  const std::unique_ptr<float[]> max_values(new float[num_components]);
  const std::unique_ptr<float[]> att_val(new float[num_components]);
  // Compute minimum values and max value difference.
  attribute.GetValue(AttributeValueIndex(0), att_val.get());
  attribute.GetValue(AttributeValueIndex(0), min_values_.data());
  attribute.GetValue(AttributeValueIndex(0), max_values.get());

  for (AttributeValueIndex i(1); i < static_cast<uint32_t>(attribute.size());
       ++i) {
    attribute.GetValue(i, att_val.get());
    for (int c = 0; c < num_components; ++c) {
      if (min_values_[c] > att_val[c]) {
        min_values_[c] = att_val[c];
      }
      if (max_values[c] < att_val[c]) {
        max_values[c] = att_val[c];
      }
    }
  }
  for (int c = 0; c < num_components; ++c) {
    if (std::isnan(min_values_[c]) || std::isinf(min_values_[c]) ||
        std::isnan(max_values[c]) || std::isinf(max_values[c])) {
      return false;
    }
    const float dif = max_values[c] - min_values_[c];
    if (dif > range_) {
      range_ = dif;
    }
  }

  // In case all values are the same, initialize the range to unit length. This
  // will ensure that all values are quantized properly to the same value.
  if (range_ == 0.f) {
    range_ = 1.f;
  }

  return true;
}